

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree.c
# Opt level: O0

xmlChar * xmlNodeListGetStringInternal(xmlDocPtr doc,xmlNode *node,int escMode)

{
  xmlBufPtr buf_00;
  xmlChar *local_40;
  xmlChar *encoded;
  xmlChar *ret;
  xmlBufPtr buf;
  _xmlNode *p_Stack_20;
  int escMode_local;
  xmlNode *node_local;
  xmlDocPtr doc_local;
  
  if (node == (xmlNode *)0x0) {
    doc_local = (xmlDocPtr)xmlStrdup("");
  }
  else if ((escMode == 0) &&
          (((node->type == XML_TEXT_NODE || (node->type == XML_CDATA_SECTION_NODE)) &&
           (node->next == (_xmlNode *)0x0)))) {
    if (node->content == (xmlChar *)0x0) {
      doc_local = (xmlDocPtr)xmlStrdup("");
    }
    else {
      doc_local = (xmlDocPtr)xmlStrdup(node->content);
    }
  }
  else {
    buf_00 = xmlBufCreate(0x32);
    p_Stack_20 = node;
    if (buf_00 == (xmlBufPtr)0x0) {
      doc_local = (xmlDocPtr)0x0;
    }
    else {
      for (; p_Stack_20 != (xmlNode *)0x0; p_Stack_20 = p_Stack_20->next) {
        if ((p_Stack_20->type == XML_TEXT_NODE) || (p_Stack_20->type == XML_CDATA_SECTION_NODE)) {
          if (p_Stack_20->content != (xmlChar *)0x0) {
            if (escMode == 0) {
              xmlBufCat(buf_00,p_Stack_20->content);
            }
            else {
              if (escMode == 1) {
                local_40 = xmlEncodeEntitiesInternal(doc,p_Stack_20->content,0);
              }
              else if (escMode == 2) {
                local_40 = xmlEncodeEntitiesInternal(doc,p_Stack_20->content,1);
              }
              else {
                local_40 = xmlEncodeSpecialChars(doc,p_Stack_20->content);
              }
              if (local_40 == (xmlChar *)0x0) {
                xmlBufFree(buf_00);
                return (xmlChar *)0x0;
              }
              xmlBufCat(buf_00,local_40);
              (*xmlFree)(local_40);
            }
          }
        }
        else if (p_Stack_20->type == XML_ENTITY_REF_NODE) {
          if (escMode == 0) {
            xmlBufGetNodeContent(buf_00,p_Stack_20);
          }
          else {
            xmlBufAdd(buf_00,(xmlChar *)"&",1);
            xmlBufCat(buf_00,p_Stack_20->name);
            xmlBufAdd(buf_00,(xmlChar *)";",1);
          }
        }
      }
      doc_local = (xmlDocPtr)xmlBufDetach(buf_00);
      xmlBufFree(buf_00);
    }
  }
  return (xmlChar *)doc_local;
}

Assistant:

static xmlChar *
xmlNodeListGetStringInternal(xmlDocPtr doc, const xmlNode *node, int escMode) {
    xmlBufPtr buf;
    xmlChar *ret;

    if (node == NULL)
        return(xmlStrdup(BAD_CAST ""));

    if ((escMode == 0) &&
        ((node->type == XML_TEXT_NODE) ||
         (node->type == XML_CDATA_SECTION_NODE)) &&
        (node->next == NULL)) {
        if (node->content == NULL)
            return(xmlStrdup(BAD_CAST ""));
        return(xmlStrdup(node->content));
    }

    buf = xmlBufCreate(50);
    if (buf == NULL)
        return(NULL);

    while (node != NULL) {
        if ((node->type == XML_TEXT_NODE) ||
            (node->type == XML_CDATA_SECTION_NODE)) {
            if (node->content != NULL) {
                if (escMode == 0) {
                    xmlBufCat(buf, node->content);
                } else {
                    xmlChar *encoded;

                    if (escMode == 1)
                        encoded = xmlEncodeEntitiesInternal(doc, node->content,
                                                            0);
                    else if (escMode == 2)
                        encoded = xmlEncodeEntitiesInternal(doc, node->content,
                                                            XML_ESCAPE_ATTR);
                    else
                        encoded = xmlEncodeSpecialChars(doc, node->content);
                    if (encoded == NULL)
                        goto error;
                    xmlBufCat(buf, encoded);
                    xmlFree(encoded);
                }
            }
        } else if (node->type == XML_ENTITY_REF_NODE) {
            if (escMode == 0) {
                xmlBufGetNodeContent(buf, node);
            } else {
                xmlBufAdd(buf, BAD_CAST "&", 1);
                xmlBufCat(buf, node->name);
                xmlBufAdd(buf, BAD_CAST ";", 1);
            }
        }

        node = node->next;
    }

    ret = xmlBufDetach(buf);
    xmlBufFree(buf);
    return(ret);

error:
    xmlBufFree(buf);
    return(NULL);
}